

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::GlobalObject::GetItemSetter
          (GlobalObject *this,uint32 index,Var *setterValue,ScriptContext *requestContext)

{
  RecyclableObject **ppRVar1;
  HostObjectBase **ppHVar2;
  DescriptorFlags local_2c;
  ScriptContext *pSStack_28;
  DescriptorFlags flags;
  ScriptContext *requestContext_local;
  Var *setterValue_local;
  GlobalObject *pGStack_10;
  uint32 index_local;
  GlobalObject *this_local;
  
  pSStack_28 = requestContext;
  requestContext_local = (ScriptContext *)setterValue;
  setterValue_local._4_4_ = index;
  pGStack_10 = this;
  local_2c = DynamicObject::GetItemSetter((DynamicObject *)this,index,setterValue,requestContext);
  if (local_2c == None) {
    ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->directHostObject);
    if (*ppRVar1 == (RecyclableObject *)0x0) {
      ppHVar2 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                          ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
      if (*ppHVar2 != (HostObjectBase *)0x0) {
        ppHVar2 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                            ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
        Js::JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem
                  ((RecyclableObject *)*ppHVar2,setterValue_local._4_4_,(Var *)requestContext_local,
                   &local_2c,pSStack_28,0);
      }
    }
    else {
      ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                          ((WriteBarrierPtr *)&this->directHostObject);
      Js::JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem
                (*ppRVar1,setterValue_local._4_4_,(Var *)requestContext_local,&local_2c,pSStack_28,0
                );
    }
  }
  return local_2c;
}

Assistant:

DescriptorFlags GlobalObject::GetItemSetter(uint32 index, Var* setterValue, ScriptContext* requestContext)
    {
        DescriptorFlags flags = DynamicObject::GetItemSetter(index, setterValue, requestContext);
        if (flags == None)
        {
            if (this->directHostObject)
            {
                // We need to look up the prototype chain here.
                JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(this->directHostObject, index, setterValue, &flags, requestContext);
            }
            else if (this->hostObject)
            {
                JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(this->hostObject, index, setterValue, &flags, requestContext);
            }
        }

        return flags;
    }